

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# IRC_Client.cpp
# Opt level: O3

string_view __thiscall
Jupiter::IRC::Client::readConfigValue(Client *this,string_view key,string_view defaultValue)

{
  string_view sVar1;
  
  if (((this->m_primary_section == (Config *)0x0) ||
      (sVar1 = Config::get(this->m_primary_section,key,(string_view)ZEXT816(0)), sVar1._M_len == 0))
     && (sVar1 = defaultValue, this->m_secondary_section != (Config *)0x0)) {
    sVar1 = Config::get(this->m_secondary_section,key,defaultValue);
  }
  return sVar1;
}

Assistant:

std::string_view Jupiter::IRC::Client::readConfigValue(std::string_view key, std::string_view defaultValue) const {
	if (m_primary_section != nullptr) {
		std::string_view val = m_primary_section->get(key);
		if (!val.empty()) {
			return val;
		}
	}

	if (m_secondary_section != nullptr) {
		return m_secondary_section->get(key, defaultValue);
	}

	return defaultValue;
}